

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*> __thiscall
fmt::v9::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar1;
  undefined8 unaff_RBX;
  detail *pdVar2;
  detail *pdVar3;
  undefined1 auVar4 [16];
  format_decimal_result<char_*> fVar5;
  
  auVar4._8_8_ = unaff_RBX;
  auVar4._0_8_ = in_RAX;
  count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar4);
  uVar1 = CONCAT44(in_register_00000014,size);
  pdVar3 = this + in_ECX;
  while (pdVar2 = pdVar3 + -2, (out < (char *)0x64) <= uVar1) {
    auVar4 = __udivti3(out,uVar1,100,0);
    *(undefined2 *)pdVar2 =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (long)(out + (long)auVar4._0_8_ * -100) * 2);
    out = auVar4._0_8_;
    pdVar3 = pdVar2;
    uVar1 = auVar4._8_8_;
  }
  if (uVar1 == 0 && (ulong)((char *)0x9 < out) <= -uVar1) {
    pdVar3[-1] = (detail)((byte)out | 0x30);
    pdVar2 = pdVar3 + -1;
  }
  else {
    *(undefined2 *)pdVar2 =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (long)out * 2);
  }
  fVar5.end = (char *)(this + in_ECX);
  fVar5.begin = (char *)pdVar2;
  return fVar5;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}